

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondZvol.cpp
# Opt level: O0

void __thiscall OpenMD::HBondZvol::process(HBondZvol *this)

{
  double dVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  SnapshotManager *this_00;
  Snapshot *pSVar6;
  double *pdVar7;
  reference pvVar8;
  reference pvVar9;
  long in_RDI;
  RealType RVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  Molecule *pMVar15;
  int binNo_1;
  int binNo;
  Vector3d mPos;
  RealType halfBoxZ_;
  RealType Lz;
  RealType Ly;
  RealType Lx;
  Mat3x3d hmat;
  int istep;
  int nFrames;
  DumpReader reader;
  bool usePeriodicBoundaryConditions_;
  RealType sliceVol;
  int nD;
  int nA;
  int nHB;
  int jj;
  int ii;
  RealType ctheta;
  RealType theta;
  RealType DHdist;
  RealType DAdist;
  Vector3d DA;
  Vector3d DH;
  Vector3d hPos;
  Vector3d aPos;
  Vector3d dPos;
  Atom *hba2;
  Atom *hba1;
  iterator hbaj;
  iterator hbai;
  iterator hbdj;
  iterator hbdi;
  HBondDonor *hbd2;
  HBondDonor *hbd1;
  Molecule *mol2;
  Molecule *mol1;
  Snapshot *in_stack_ffffffffffffe958;
  DumpReader *in_stack_ffffffffffffe960;
  Molecule *in_stack_ffffffffffffe968;
  SelectionManager *in_stack_ffffffffffffe970;
  HBondDonor *in_stack_ffffffffffffe978;
  Molecule *in_stack_ffffffffffffe980;
  SelectionEvaluator *in_stack_ffffffffffffe998;
  Molecule *in_stack_ffffffffffffe9b8;
  HBondDonor *in_stack_ffffffffffffe9d8;
  Snapshot *in_stack_ffffffffffffe9e0;
  double in_stack_ffffffffffffe9e8;
  DumpReader *in_stack_ffffffffffffe9f0;
  string *in_stack_ffffffffffffebb0;
  SimInfo *in_stack_ffffffffffffebb8;
  DumpReader *in_stack_ffffffffffffebc0;
  RectMatrix<double,_3U,_3U> local_13d0;
  int local_1388;
  int local_1374;
  HBondZvol *in_stack_fffffffffffffeb0;
  Vector<double,_3U> local_a0 [3];
  Snapshot *local_58;
  SelectionManager *local_50;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_48;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_40;
  __normal_iterator<OpenMD::Molecule::HBondDonor_**,_std::vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>_>
  local_38;
  __normal_iterator<OpenMD::Molecule::HBondDonor_**,_std::vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>_>
  local_30;
  HBondDonor *local_28;
  HBondDonor *local_20;
  Molecule *local_18;
  DumpReader *local_10;
  
  __gnu_cxx::
  __normal_iterator<OpenMD::Molecule::HBondDonor_**,_std::vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>_>
  ::__normal_iterator(&local_30);
  __gnu_cxx::
  __normal_iterator<OpenMD::Molecule::HBondDonor_**,_std::vector<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>_>
  ::__normal_iterator(&local_38);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_40);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_48);
  Vector3<double>::Vector3((Vector3<double> *)0x16c000);
  Vector3<double>::Vector3((Vector3<double> *)0x16c00d);
  Vector3<double>::Vector3((Vector3<double> *)0x16c01a);
  Vector3<double>::Vector3((Vector3<double> *)0x16c027);
  Vector3<double>::Vector3((Vector3<double> *)0x16c034);
  SimInfo::getSimParams(*(SimInfo **)(in_RDI + 8));
  bVar3 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x16c04d);
  DumpReader::DumpReader
            (in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8,in_stack_ffffffffffffebb0);
  local_1374 = DumpReader::getNFrames(in_stack_ffffffffffffe960);
  *(undefined4 *)(in_RDI + 0xd58) = 0;
  for (local_1388 = 0; local_1388 < local_1374; local_1388 = *(int *)(in_RDI + 0x30) + local_1388) {
    DumpReader::readFrame(in_stack_ffffffffffffe9f0,(int)((ulong)in_stack_ffffffffffffe9e8 >> 0x20))
    ;
    this_00 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 8));
    pSVar6 = SnapshotManager::getCurrentSnapshot(this_00);
    *(Snapshot **)(in_RDI + 200) = pSVar6;
    Snapshot::getHmat(in_stack_ffffffffffffe958);
    RectMatrix<double,_3U,_3U>::operator()(&local_13d0,0,0);
    RectMatrix<double,_3U,_3U>::operator()(&local_13d0,1,1);
    RectMatrix<double,_3U,_3U>::operator()(&local_13d0,2,2);
    RectMatrix<double,_3U,_3U>::operator()
              (&local_13d0,*(uint *)(in_RDI + 0xdc0),*(uint *)(in_RDI + 0xdc0));
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffe970,
               (value_type_conflict2 *)in_stack_ffffffffffffe968);
    RVar10 = Snapshot::getVolume((Snapshot *)in_stack_ffffffffffffe960);
    dVar11 = RVar10 / (double)*(uint *)(in_RDI + 0x34);
    pdVar7 = RectMatrix<double,_3U,_3U>::operator()
                       (&local_13d0,*(uint *)(in_RDI + 0xdc0),*(uint *)(in_RDI + 0xdc0));
    dVar1 = *pdVar7;
    bVar4 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x1b8));
    if (bVar4) {
      SelectionEvaluator::evaluate(in_stack_ffffffffffffe998);
      SelectionManager::setSelectionSet
                (in_stack_ffffffffffffe970,(SelectionSet *)in_stack_ffffffffffffe968);
      SelectionSet::~SelectionSet((SelectionSet *)0x16c32e);
    }
    bVar4 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x7f0));
    if (bVar4) {
      SelectionEvaluator::evaluate(in_stack_ffffffffffffe998);
      SelectionManager::setSelectionSet
                (in_stack_ffffffffffffe970,(SelectionSet *)in_stack_ffffffffffffe968);
      SelectionSet::~SelectionSet((SelectionSet *)0x16c405);
    }
    local_10 = (DumpReader *)
               SelectionManager::beginSelectedMolecule
                         (in_stack_ffffffffffffe970,(int *)in_stack_ffffffffffffe968);
    while (local_10 != (DumpReader *)0x0) {
      Molecule::getCom(in_stack_ffffffffffffe9b8);
      local_18 = SelectionManager::beginSelectedMolecule
                           (in_stack_ffffffffffffe970,(int *)in_stack_ffffffffffffe968);
      while (local_18 != (Molecule *)0x0) {
        local_20 = Molecule::beginHBondDonor
                             (in_stack_ffffffffffffe980,(iterator *)in_stack_ffffffffffffe978);
        while (local_20 != (HBondDonor *)0x0) {
          StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffe968);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_ffffffffffffe960,
                     (Vector3<double> *)in_stack_ffffffffffffe958);
          StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffe968);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_ffffffffffffe960,
                     (Vector3<double> *)in_stack_ffffffffffffe958);
          OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffe968,
                            (Vector<double,_3U> *)in_stack_ffffffffffffe960);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_ffffffffffffe968,
                     (Vector<double,_3U> *)in_stack_ffffffffffffe960);
          Snapshot::wrapVector(in_stack_ffffffffffffe9e0,(Vector3d *)in_stack_ffffffffffffe9d8);
          dVar12 = Vector<double,_3U>::length((Vector<double,_3U> *)0x16c5f1);
          local_58 = (Snapshot *)
                     Molecule::beginHBondAcceptor
                               (in_stack_ffffffffffffe980,(iterator *)in_stack_ffffffffffffe978);
          while (local_58 != (Snapshot *)0x0) {
            StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffe968);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_ffffffffffffe960,
                       (Vector3<double> *)in_stack_ffffffffffffe958);
            OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffe968,
                              (Vector<double,_3U> *)in_stack_ffffffffffffe960);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_ffffffffffffe968,
                       (Vector<double,_3U> *)in_stack_ffffffffffffe960);
            Snapshot::wrapVector(in_stack_ffffffffffffe9e0,(Vector3d *)in_stack_ffffffffffffe9d8);
            dVar13 = Vector<double,_3U>::length((Vector<double,_3U> *)0x16c6db);
            if (dVar13 < *(double *)(in_RDI + 0xd48)) {
              dVar14 = dot<double,3u>((Vector<double,_3U> *)in_stack_ffffffffffffe970,
                                      (Vector<double,_3U> *)in_stack_ffffffffffffe968);
              dVar13 = acos(dVar14 / (dVar12 * dVar13));
              if ((dVar13 * 180.0) / 3.141592653589793 < *(double *)(in_RDI + 0xd50)) {
                if (bVar3) {
                  Snapshot::wrapVector
                            (in_stack_ffffffffffffe9e0,(Vector3d *)in_stack_ffffffffffffe9d8);
                }
                uVar2 = *(uint *)(in_RDI + 0x34);
                pdVar7 = Vector<double,_3U>::operator[](local_a0,*(uint *)(in_RDI + 0xdc0));
                in_stack_ffffffffffffe9f0 = (DumpReader *)((double)uVar2 * (dVar1 * 0.5 + *pdVar7));
                pdVar7 = RectMatrix<double,_3U,_3U>::operator()
                                   (&local_13d0,*(uint *)(in_RDI + 0xdc0),*(uint *)(in_RDI + 0xdc0))
                ;
                dVar13 = (double)in_stack_ffffffffffffe9f0 / *pdVar7;
                in_stack_ffffffffffffe9e8 = 1.0 / dVar11;
                pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd78),
                                    (long)(int)dVar13);
                *pvVar8 = in_stack_ffffffffffffe9e8 + *pvVar8;
                pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd90),
                                    (long)(int)dVar13);
                *pvVar9 = *pvVar9 + 1;
              }
            }
            in_stack_ffffffffffffe9e0 =
                 (Snapshot *)
                 Molecule::nextHBondAcceptor
                           (in_stack_ffffffffffffe980,(iterator *)in_stack_ffffffffffffe978);
            local_58 = in_stack_ffffffffffffe9e0;
          }
          in_stack_ffffffffffffe9d8 =
               Molecule::nextHBondDonor
                         (in_stack_ffffffffffffe980,(iterator *)in_stack_ffffffffffffe978);
          local_20 = in_stack_ffffffffffffe9d8;
        }
        local_50 = (SelectionManager *)
                   Molecule::beginHBondAcceptor
                             (in_stack_ffffffffffffe980,(iterator *)in_stack_ffffffffffffe978);
        while (local_50 != (SelectionManager *)0x0) {
          StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffe968);
          Vector3<double>::operator=
                    ((Vector3<double> *)in_stack_ffffffffffffe960,
                     (Vector3<double> *)in_stack_ffffffffffffe958);
          local_28 = Molecule::beginHBondDonor
                               (in_stack_ffffffffffffe980,(iterator *)in_stack_ffffffffffffe978);
          while (local_28 != (HBondDonor *)0x0) {
            StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffe968);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_ffffffffffffe960,
                       (Vector3<double> *)in_stack_ffffffffffffe958);
            OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffe968,
                              (Vector<double,_3U> *)in_stack_ffffffffffffe960);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_ffffffffffffe968,
                       (Vector<double,_3U> *)in_stack_ffffffffffffe960);
            Snapshot::wrapVector(in_stack_ffffffffffffe9e0,(Vector3d *)in_stack_ffffffffffffe9d8);
            dVar12 = Vector<double,_3U>::length((Vector<double,_3U> *)0x16cac7);
            if (dVar12 < *(double *)(in_RDI + 0xd48)) {
              StuntDouble::getPos((StuntDouble *)in_stack_ffffffffffffe968);
              Vector3<double>::operator=
                        ((Vector3<double> *)in_stack_ffffffffffffe960,
                         (Vector3<double> *)in_stack_ffffffffffffe958);
              OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffe968,
                                (Vector<double,_3U> *)in_stack_ffffffffffffe960);
              Vector3<double>::operator=
                        ((Vector3<double> *)in_stack_ffffffffffffe968,
                         (Vector<double,_3U> *)in_stack_ffffffffffffe960);
              Snapshot::wrapVector(in_stack_ffffffffffffe9e0,(Vector3d *)in_stack_ffffffffffffe9d8);
              pMVar15 = (Molecule *)Vector<double,_3U>::length((Vector<double,_3U> *)0x16cb94);
              in_stack_ffffffffffffe9b8 = pMVar15;
              dVar13 = dot<double,3u>((Vector<double,_3U> *)in_stack_ffffffffffffe970,
                                      (Vector<double,_3U> *)in_stack_ffffffffffffe968);
              dVar12 = acos(dVar13 / ((double)pMVar15 * dVar12));
              if ((dVar12 * 180.0) / 3.141592653589793 < *(double *)(in_RDI + 0xd50)) {
                if (bVar3) {
                  Snapshot::wrapVector
                            (in_stack_ffffffffffffe9e0,(Vector3d *)in_stack_ffffffffffffe9d8);
                }
                in_stack_ffffffffffffe998 = (SelectionEvaluator *)(double)*(uint *)(in_RDI + 0x34);
                pdVar7 = Vector<double,_3U>::operator[](local_a0,*(uint *)(in_RDI + 0xdc0));
                dVar12 = (double)in_stack_ffffffffffffe998 * (dVar1 * 0.5 + *pdVar7);
                pdVar7 = RectMatrix<double,_3U,_3U>::operator()
                                   (&local_13d0,*(uint *)(in_RDI + 0xdc0),*(uint *)(in_RDI + 0xdc0))
                ;
                iVar5 = (int)(dVar12 / *pdVar7);
                in_stack_ffffffffffffe980 = (Molecule *)(1.0 / dVar11);
                pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xd78),
                                    (long)iVar5);
                *pvVar8 = (double)in_stack_ffffffffffffe980 + *pvVar8;
                pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd90),
                                    (long)iVar5);
                *pvVar9 = *pvVar9 + 1;
              }
            }
            in_stack_ffffffffffffe978 =
                 Molecule::nextHBondDonor
                           (in_stack_ffffffffffffe980,(iterator *)in_stack_ffffffffffffe978);
            local_28 = in_stack_ffffffffffffe978;
          }
          in_stack_ffffffffffffe970 =
               (SelectionManager *)
               Molecule::nextHBondAcceptor
                         (in_stack_ffffffffffffe980,(iterator *)in_stack_ffffffffffffe978);
          local_50 = in_stack_ffffffffffffe970;
        }
        in_stack_ffffffffffffe968 =
             SelectionManager::nextSelectedMolecule
                       (in_stack_ffffffffffffe970,(int *)in_stack_ffffffffffffe968);
        local_18 = in_stack_ffffffffffffe968;
      }
      in_stack_ffffffffffffe960 =
           (DumpReader *)
           SelectionManager::nextSelectedMolecule
                     (in_stack_ffffffffffffe970,(int *)in_stack_ffffffffffffe968);
      local_10 = in_stack_ffffffffffffe960;
    }
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x16ce6c);
  }
  writeDensity(in_stack_fffffffffffffeb0);
  DumpReader::~DumpReader(in_stack_ffffffffffffe960);
  return;
}

Assistant:

void HBondZvol::process() {
    Molecule* mol1;
    Molecule* mol2;
    Molecule::HBondDonor* hbd1;
    Molecule::HBondDonor* hbd2;
    std::vector<Molecule::HBondDonor*>::iterator hbdi;
    std::vector<Molecule::HBondDonor*>::iterator hbdj;
    std::vector<Atom*>::iterator hbai;
    std::vector<Atom*>::iterator hbaj;
    Atom* hba1;
    Atom* hba2;
    Vector3d dPos;
    Vector3d aPos;
    Vector3d hPos;
    Vector3d DH;
    Vector3d DA;
    RealType DAdist, DHdist, theta, ctheta;
    int ii, jj;
    int nHB, nA, nD;
    RealType sliceVol;

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames   = reader.getNFrames();
    frameCounter_ = 0;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      Mat3x3d hmat = currentSnapshot_->getHmat();

      RealType Lx = hmat(0, 0);
      RealType Ly = hmat(1, 1);
      RealType Lz = hmat(2, 2);

      zBox_.push_back(hmat(axis_, axis_));
      sliceVol = currentSnapshot_->getVolume() / nBins_;

      RealType halfBoxZ_ = hmat(axis_, axis_) / 2.0;

      if (evaluator1_.isDynamic()) {
        seleMan1_.setSelectionSet(evaluator1_.evaluate());
      }

      if (evaluator2_.isDynamic()) {
        seleMan2_.setSelectionSet(evaluator2_.evaluate());
      }

      for (mol1 = seleMan1_.beginSelectedMolecule(ii); mol1 != NULL;
           mol1 = seleMan1_.nextSelectedMolecule(ii)) {
        // We're collecting statistics on the molecules in selection 1:
        nHB           = 0;
        nA            = 0;
        nD            = 0;
        Vector3d mPos = mol1->getCom();

        for (mol2 = seleMan2_.beginSelectedMolecule(jj); mol2 != NULL;
             mol2 = seleMan2_.nextSelectedMolecule(jj)) {
          // loop over the possible donors in molecule 1:
          for (hbd1 = mol1->beginHBondDonor(hbdi); hbd1 != NULL;
               hbd1 = mol1->nextHBondDonor(hbdi)) {
            dPos = hbd1->donorAtom->getPos();
            hPos = hbd1->donatedHydrogen->getPos();
            DH   = hPos - dPos;
            currentSnapshot_->wrapVector(DH);
            DHdist = DH.length();

            // loop over the possible acceptors in molecule 2:
            for (hba2 = mol2->beginHBondAcceptor(hbaj); hba2 != NULL;
                 hba2 = mol2->nextHBondAcceptor(hbaj)) {
              aPos = hba2->getPos();
              DA   = aPos - dPos;
              currentSnapshot_->wrapVector(DA);
              DAdist = DA.length();

              // Distance criteria: are the donor and acceptor atoms
              // close enough?
              if (DAdist < rCut_) {
                ctheta = dot(DH, DA) / (DHdist * DAdist);
                theta  = acos(ctheta) * 180.0 / Constants::PI;

                // Angle criteria: are the D-H and D-A and vectors close?
                if (theta < thetaCut_) {
                  // molecule 1 is a Hbond donor:
                  nHB++;
                  nD++;
                  if (usePeriodicBoundaryConditions_)
                    currentSnapshot_->wrapVector(hPos);
                  int binNo = int(nBins_ * (halfBoxZ_ + hPos[axis_]) /
                                  hmat(axis_, axis_));
                  sliceQ_[binNo] += 1 / sliceVol;
                  sliceCount_[binNo] += 1;
                }
              }
            }
          }

          // now loop over the possible acceptors in molecule 1:
          for (hba1 = mol1->beginHBondAcceptor(hbai); hba1 != NULL;
               hba1 = mol1->nextHBondAcceptor(hbai)) {
            aPos = hba1->getPos();

            // loop over the possible donors in molecule 2:
            for (hbd2 = mol2->beginHBondDonor(hbdj); hbd2 != NULL;
                 hbd2 = mol2->nextHBondDonor(hbdj)) {
              dPos = hbd2->donorAtom->getPos();

              DA = aPos - dPos;
              currentSnapshot_->wrapVector(DA);
              DAdist = DA.length();

              // Distance criteria: are the donor and acceptor atoms
              // close enough?
              if (DAdist < rCut_) {
                hPos = hbd2->donatedHydrogen->getPos();
                DH   = hPos - dPos;
                currentSnapshot_->wrapVector(DH);
                DHdist = DH.length();
                ctheta = dot(DH, DA) / (DHdist * DAdist);
                theta  = acos(ctheta) * 180.0 / Constants::PI;
                // Angle criteria: are the D-H and D-A and vectors close?
                if (theta < thetaCut_) {
                  // molecule 1 is a Hbond acceptor:
                  nHB++;
                  nA++;
                  if (usePeriodicBoundaryConditions_)
                    currentSnapshot_->wrapVector(hPos);
                  int binNo = int(nBins_ * (halfBoxZ_ + hPos[axis_]) /
                                  hmat(axis_, axis_));
                  sliceQ_[binNo] += 1 / sliceVol;
                  sliceCount_[binNo] += 1;
                }
              }
            }
          }
        }
      }
    }
    writeDensity();
  }